

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

unique_ptr<int,_std::default_delete<int>_> __thiscall
(anonymous_namespace)::roundtrip<std::unique_ptr<int,std::default_delete<int>>>
          (_anonymous_namespace_ *this,unique_ptr<int,_std::default_delete<int>_> *in)

{
  Result *in_R9;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  OutputStream ostream;
  stringstream stream;
  
  *(undefined8 *)this = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  serialize<OutputStream>(in,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0 = (ulong)((in->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) * 4 + 1;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  local_1d8.lhs = (unsigned_long)&stream;
  mserialize::detail::BuiltinDeserializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  deserialize<InputStream>
            ((unique_ptr<int,_std::default_delete<int>_> *)this,(InputStream *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
         (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)this;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}